

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
               (void)

{
  _List_node_base *__args;
  uint *__args_1;
  Underlying_matrix *this;
  _Base_ptr p_Var1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  undefined1 *puVar4;
  _List_node_base *p_Var5;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<unsigned_int> __l_07;
  initializer_list<unsigned_int> __l_08;
  initializer_list<unsigned_int> __l_09;
  initializer_list<unsigned_int> __l_10;
  initializer_list<unsigned_int> __l_11;
  initializer_list<unsigned_int> __l_12;
  initializer_list<unsigned_int> __l_13;
  initializer_list<unsigned_int> __l_14;
  initializer_list<unsigned_int> __l_15;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  undefined4 local_970 [2];
  undefined8 local_968;
  shared_count sStack_960;
  undefined8 local_958;
  uint local_950 [2];
  undefined8 *local_948;
  char **local_940;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  reducedMatrix;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  char *local_8b0;
  char *local_8a8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_8a0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_888;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_870;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_858;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_840;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_828;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_810;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_7f8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_7e0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_7c8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_7b0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_798;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_780;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_768;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_750;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_738;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_720;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  undefined1 *local_638;
  undefined1 *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>
  m;
  
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>
  ::Matrix(&m,0x11,2);
  bars1._M_t._M_impl._0_8_ = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  this = &m.matrix_;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_720,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
              *)this,0,(initializer_list<unsigned_int> *)&bars1,0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_720);
  bars1._M_t._M_impl._0_8_ = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_738,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
              *)this,1,(initializer_list<unsigned_int> *)&bars1,0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_738);
  bars1._M_t._M_impl._0_8_ = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_750,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
              *)this,2,(initializer_list<unsigned_int> *)&bars1,0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_750);
  bars1._M_t._M_impl._0_8_ = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_768,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
              *)this,3,(initializer_list<unsigned_int> *)&bars1,0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_768);
  bars1._M_t._M_impl._0_8_ = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_780,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
              *)this,4,(initializer_list<unsigned_int> *)&bars1,0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_780);
  bars1._M_t._M_impl._0_8_ = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_798,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
              *)this,5,(initializer_list<unsigned_int> *)&bars1,0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_798);
  bars1._M_t._M_impl._0_8_ = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_7b0,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
              *)this,6,(initializer_list<unsigned_int> *)&bars1,0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_7b0);
  bars2._M_t._M_impl._0_8_ = 0x100000000;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars1._M_t._M_impl._0_8_ = &bars2;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_7c8,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
              *)this,10,(initializer_list<unsigned_int> *)&bars1,1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_7c8);
  bars2._M_t._M_impl._0_8_ = 0x300000001;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars1._M_t._M_impl._0_8_ = &bars2;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_7e0,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
              *)this,0xb,(initializer_list<unsigned_int> *)&bars1,1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_7e0);
  bars2._M_t._M_impl._0_8_ = 0x300000002;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars1._M_t._M_impl._0_8_ = &bars2;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_7f8,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
              *)this,0xc,(initializer_list<unsigned_int> *)&bars1,1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_7f8);
  bars2._M_t._M_impl._0_8_ = 0x400000002;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars1._M_t._M_impl._0_8_ = &bars2;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_810,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
              *)this,0xd,(initializer_list<unsigned_int> *)&bars1,1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_810);
  bars2._M_t._M_impl._0_8_ = 0x400000003;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars1._M_t._M_impl._0_8_ = &bars2;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_828,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
              *)this,0xe,(initializer_list<unsigned_int> *)&bars1,1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_828);
  bars2._M_t._M_impl._0_8_ = 0x600000002;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars1._M_t._M_impl._0_8_ = &bars2;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_840,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
              *)this,0xf,(initializer_list<unsigned_int> *)&bars1,1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_840);
  bars2._M_t._M_impl._0_8_ = 0x600000004;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars1._M_t._M_impl._0_8_ = &bars2;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_858,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
              *)this,0x10,(initializer_list<unsigned_int> *)&bars1,1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_858);
  bars2._M_t._M_impl._0_8_ = 0x600000005;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars1._M_t._M_impl._0_8_ = &bars2;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_870,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
              *)this,0x11,(initializer_list<unsigned_int> *)&bars1,1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_870);
  bars2._M_t._M_impl._0_8_ = 0xd0000000c;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xe;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 3;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars1._M_t._M_impl._0_8_ = &bars2;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_888,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
              *)this,0x1e,(initializer_list<unsigned_int> *)&bars1,2);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_888);
  bars2._M_t._M_impl._0_8_ = 0xf0000000d;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x10;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 3;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars1._M_t._M_impl._0_8_ = &bars2;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_8a0,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
              *)this,0x1f,(initializer_list<unsigned_int> *)&bars1,2);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_8a0);
  reducedMatrix.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  reducedMatrix.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  reducedMatrix.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bars2._M_t._M_impl._0_8_ = bars2._M_t._M_impl._0_8_ & 0xffffffff00000000;
  __l._M_len = 1;
  __l._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0x100000000;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l_00,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0x200000000;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l_01,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0x300000000;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l_02,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0x400000000;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l_03,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0x500000000;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l_04,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0x600000000;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l_05,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  bars2._M_t._M_impl._0_4_ = 10;
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l_06,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0xb0000000a;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l_07,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0xb0000000a;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xc;
  __l_08._M_len = 3;
  __l_08._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l_08,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0xb0000000a;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xc;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0xd;
  __l_09._M_len = 4;
  __l_09._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l_09,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0xd0000000c;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xe;
  __l_10._M_len = 3;
  __l_10._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l_10,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0xb0000000a;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xc;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0xf;
  __l_11._M_len = 4;
  __l_11._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l_11,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0xf0000000d;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x10;
  __l_12._M_len = 3;
  __l_12._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l_12,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0xb0000000a;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xc;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0xf;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)CONCAT44(bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,0x11);
  __l_13._M_len = 5;
  __l_13._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l_13,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  bars2._M_t._M_impl._0_4_ = 0x1e;
  __l_14._M_len = 1;
  __l_14._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l_14,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  bars2._M_t._M_impl._0_4_ = 0x1f;
  __l_15._M_len = 1;
  __l_15._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l_15,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
            (&reducedMatrix,&m);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars1._M_t._M_impl.super__Rb_tree_header._M_header;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars2._M_t._M_impl.super__Rb_tree_header._M_header;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars3._M_t._M_impl.super__Rb_tree_header._M_header;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var5 = m.matrix_.super_Chain_pairing_option.barcode_.
                super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 = bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
      (Chain_pairing_option *)p_Var5 != &m.matrix_.super_Chain_pairing_option;
      p_Var5 = p_Var5->_M_next) {
    __args = p_Var5 + 1;
    __args_1 = (uint *)((long)&p_Var5[1]._M_next + 4);
    std::
    _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
    ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
              ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                *)&bars1,(int *)__args,__args_1,(uint *)&p_Var5[1]._M_prev);
    std::
    _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
    ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
              ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                *)&bars2,(int *)__args,__args_1,(uint *)&p_Var5[1]._M_prev);
    local_950[0] = *(uint *)&p_Var5[1]._M_prev;
    local_958 = (undefined **)__args->_M_next;
    std::
    _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
    ::_M_emplace_unique<int&,unsigned_int&,unsigned_int&>
              ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                *)&bars3,(int *)&local_958,(uint *)((long)&local_958 + 4),local_950);
  }
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0x634);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_190 = "";
  local_970[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_198,0x634,1,2,&p_Var1[1]._M_parent,"std::get<0>(*it)",local_970,"0");
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a8,0x635);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1c0 = "";
  local_970[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_1c8,0x635,1,2,&p_Var1[1].field_0x4,"std::get<1>(*it)",local_970,"0");
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x636);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f0 = "";
  local_970[0] = 0xffffffff;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_1f8,0x636,1,2,p_Var1 + 1,"std::get<2>(*it)",local_970,"-1");
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_208,0x638);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_220 = "";
  local_970[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_228,0x638,1,2,&p_Var3[1]._M_parent,"std::get<0>(*it)",local_970,"0");
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_238,0x639);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_250 = "";
  local_970[0] = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_258,0x639,1,2,&p_Var3[1].field_0x4,"std::get<1>(*it)",local_970,"1");
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_268,0x63a);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_280 = "";
  local_970[0] = 7;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_288,0x63a,1,2,p_Var3 + 1,"std::get<2>(*it)",local_970,"7");
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_298,0x63c);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2b0 = "";
  local_970[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_2b8,0x63c,1,2,&p_Var3[1]._M_parent,"std::get<0>(*it)",local_970,"0");
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2c8,0x63d);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2e0 = "";
  local_970[0] = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_2e8,0x63d,1,2,&p_Var3[1].field_0x4,"std::get<1>(*it)",local_970,"2");
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f8,0x63e);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_310 = "";
  local_970[0] = 9;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_318,0x63e,1,2,p_Var3 + 1,"std::get<2>(*it)",local_970,"9");
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_328,0x640);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_340 = "";
  local_970[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_348,0x640,1,2,&p_Var3[1]._M_parent,"std::get<0>(*it)",local_970,"0");
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_358,0x641);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_370 = "";
  local_970[0] = 3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_378,0x641,1,2,&p_Var3[1].field_0x4,"std::get<1>(*it)",local_970,"3");
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_388,0x642);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3a0 = "";
  local_970[0] = 8;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_3a8,0x642,1,2,p_Var3 + 1,"std::get<2>(*it)",local_970,"8");
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3b8,0x644);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3d0 = "";
  local_970[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_3d8,0x644,1,2,&p_Var3[1]._M_parent,"std::get<0>(*it)",local_970,"0");
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3e8,0x645);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_400 = "";
  local_970[0] = 4;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_408,0x645,1,2,&p_Var3[1].field_0x4,"std::get<1>(*it)",local_970,"4");
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_418,0x646);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_430 = "";
  local_970[0] = 10;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_438,0x646,1,2,p_Var3 + 1,"std::get<2>(*it)",local_970,"10");
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_448,0x648);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_460 = "";
  local_970[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_468,0x648,1,2,&p_Var3[1]._M_parent,"std::get<0>(*it)",local_970,"0");
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_478,0x649);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_490 = "";
  local_970[0] = 5;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_498,0x649,1,2,&p_Var3[1].field_0x4,"std::get<1>(*it)",local_970,"5");
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4a8,0x64a);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c0 = "";
  local_970[0] = 0xe;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_4c8,0x64a,1,2,p_Var3 + 1,"std::get<2>(*it)",local_970,"14");
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4d8,0x64c);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4f0 = "";
  local_970[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_4f8,0x64c,1,2,&p_Var3[1]._M_parent,"std::get<0>(*it)",local_970,"0");
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_508,0x64d);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_520 = "";
  local_970[0] = 6;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_528,0x64d,1,2,&p_Var3[1].field_0x4,"std::get<1>(*it)",local_970,"6");
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_530 = "";
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_538,0x64e);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_550 = "";
  local_970[0] = 0xc;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_558,0x64e,1,2,p_Var3 + 1,"std::get<2>(*it)",local_970,"12");
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_568,0x650);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_580 = "";
  local_970[0] = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_588,0x650,1,2,&p_Var3[1]._M_parent,"std::get<0>(*it)",local_970,"1");
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_598,0x651);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5b0 = "";
  local_970[0] = 0xb;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_5b8,0x651,1,2,&p_Var3[1].field_0x4,"std::get<1>(*it)",local_970,"11")
  ;
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5c8,0x652);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5e0 = "";
  local_970[0] = 0xf;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_5e8,0x652,1,2,p_Var3 + 1,"std::get<2>(*it)",local_970,"15");
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_5f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5f8,0x654);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_618 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_610 = "";
  local_970[0] = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_618,0x654,1,2,&p_Var3[1]._M_parent,"std::get<0>(*it)",local_970,"1");
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_620 = "";
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_628,0x655);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_648 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_640 = "";
  local_970[0] = 0xd;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_648,0x655,1,2,&p_Var3[1].field_0x4,"std::get<1>(*it)",local_970,"13")
  ;
  local_658 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_650 = "";
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_658,0x656);
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe138;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_940 = (char **)0x19e294;
  local_678 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_670 = "";
  local_970[0] = 0x10;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_958,&local_678,0x656,1,2,p_Var3 + 1,"std::get<2>(*it)",local_970,"16");
  puVar4 = (undefined1 *)std::_Rb_tree_increment(p_Var3);
  local_688 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_680 = "";
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_688,0x658);
  local_968 = 0;
  sStack_960.pi_ = (sp_counted_base *)0x0;
  local_8b0 = "it == bars1.end()";
  local_8a8 = "";
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe278;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_6a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6a0 = "";
  local_940 = &local_8b0;
  local_970[0]._0_1_ = (_Rb_tree_header *)puVar4 == &bars1._M_t._M_impl.super__Rb_tree_header;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_960);
  local_6b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6b0 = "";
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_6b8,0x65a);
  local_970[0]._0_1_ = std::operator==(&bars1._M_t,&bars2._M_t);
  local_968 = 0;
  sStack_960.pi_ = (sp_counted_base *)0x0;
  local_8b0 = "bars1 == bars2";
  local_8a8 = "";
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe278;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_6d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6d0 = "";
  local_940 = &local_8b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_960);
  local_6e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6e0 = "";
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_6e8,0x65b);
  bVar2 = std::operator==(&bars1._M_t,&bars3._M_t);
  local_970[0] = CONCAT31(local_970[0]._1_3_,bVar2);
  local_968 = 0;
  sStack_960.pi_ = (sp_counted_base *)0x0;
  local_8b0 = "bars1 == bars3";
  local_8a8 = "";
  local_950[0] = local_950[0] & 0xffffff00;
  local_958 = &PTR__lazy_ostream_001fe278;
  local_948 = &boost::unit_test::lazy_ostream::inst;
  local_708 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_700 = "";
  local_940 = &local_8b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_960);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars3._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars2._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars1._M_t);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&reducedMatrix);
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>
  ::~Matrix(&m);
  return;
}

Assistant:

void test_shifted_barcode1() {
  using C = typename Matrix::Column;
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  Matrix m(17, 2);
  if constexpr (is_z2<C>()) {
    m.insert_boundary(0, {}, 0);
    m.insert_boundary(1, {}, 0);
    m.insert_boundary(2, {}, 0);
    m.insert_boundary(3, {}, 0);
    m.insert_boundary(4, {}, 0);
    m.insert_boundary(5, {}, 0);
    m.insert_boundary(6, {}, 0);
    m.insert_boundary(10, {0, 1}, 1);
    m.insert_boundary(11, {1, 3}, 1);
    m.insert_boundary(12, {2, 3}, 1);
    m.insert_boundary(13, {2, 4}, 1);
    m.insert_boundary(14, {3, 4}, 1);
    m.insert_boundary(15, {2, 6}, 1);
    m.insert_boundary(16, {4, 6}, 1);
    m.insert_boundary(17, {5, 6}, 1);
    m.insert_boundary(30, {12, 13, 14}, 2);
    m.insert_boundary(31, {13, 15, 16}, 2);
  } else {
    m.insert_boundary(0, {}, 0);
    m.insert_boundary(1, {}, 0);
    m.insert_boundary(2, {}, 0);
    m.insert_boundary(3, {}, 0);
    m.insert_boundary(4, {}, 0);
    m.insert_boundary(5, {}, 0);
    m.insert_boundary(6, {}, 0);
    m.insert_boundary(10, {{0, 1}, {1, 1}}, 1);
    m.insert_boundary(11, {{1, 1}, {3, 1}}, 1);
    m.insert_boundary(12, {{2, 1}, {3, 1}}, 1);
    m.insert_boundary(13, {{2, 1}, {4, 1}}, 1);
    m.insert_boundary(14, {{3, 1}, {4, 1}}, 1);
    m.insert_boundary(15, {{2, 1}, {6, 1}}, 1);
    m.insert_boundary(16, {{4, 1}, {6, 1}}, 1);
    m.insert_boundary(17, {{5, 1}, {6, 1}}, 1);
    m.insert_boundary(30, {{12, 1}, {13, 1}, {14, 1}}, 2);
    m.insert_boundary(31, {{13, 1}, {15, 1}, {16, 1}}, 2);
  }

  const auto& barcode = m.get_current_barcode();

  std::vector<witness_content<C> > reducedMatrix;
  if constexpr (is_z2<C>()) {
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({0, 1});
      reducedMatrix.push_back({1, 3});
      reducedMatrix.push_back({1, 2});
      reducedMatrix.push_back({2, 4});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({2, 6});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({2, 5});
      reducedMatrix.push_back({12, 13, 14});
      reducedMatrix.push_back({13, 15, 16});
    } else {
      reducedMatrix.push_back({0});
      reducedMatrix.push_back({0, 1});
      reducedMatrix.push_back({0, 2});
      reducedMatrix.push_back({0, 3});
      reducedMatrix.push_back({0, 4});
      reducedMatrix.push_back({0, 5});
      reducedMatrix.push_back({0, 6});
      reducedMatrix.push_back({10});
      reducedMatrix.push_back({10, 11});
      reducedMatrix.push_back({10, 11, 12});
      reducedMatrix.push_back({10, 11, 12, 13});
      reducedMatrix.push_back({12, 13, 14});
      reducedMatrix.push_back({10, 11, 12, 15});
      reducedMatrix.push_back({13, 15, 16});
      reducedMatrix.push_back({10, 11, 12, 15, 17});
      reducedMatrix.push_back({30});
      reducedMatrix.push_back({31});
    }
  } else {
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{0, 1}, {1, 1}});
      reducedMatrix.push_back({{1, 1}, {3, 1}});
      reducedMatrix.push_back({{1, 1}, {2, 1}});
      reducedMatrix.push_back({{2, 1}, {4, 1}});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{2, 1}, {6, 1}});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{2, 1}, {5, 1}});
      reducedMatrix.push_back({{12, 1}, {13, 1}, {14, 1}});
      reducedMatrix.push_back({{13, 1}, {15, 1}, {16, 1}});
    } else {
      reducedMatrix.push_back({{0, 1}});
      reducedMatrix.push_back({{0, 1}, {1, 1}});
      reducedMatrix.push_back({{0, 1}, {2, 1}});
      reducedMatrix.push_back({{0, 1}, {3, 1}});
      reducedMatrix.push_back({{0, 1}, {4, 1}});
      reducedMatrix.push_back({{0, 1}, {5, 1}});
      reducedMatrix.push_back({{0, 1}, {6, 1}});
      reducedMatrix.push_back({{10, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}, {13, 1}});
      reducedMatrix.push_back({{12, 1}, {13, 1}, {14, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}, {15, 1}});
      reducedMatrix.push_back({{13, 1}, {15, 1}, {16, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}, {15, 1}, {17, 1}});
      reducedMatrix.push_back({{30, 1}});
      reducedMatrix.push_back({{31, 1}});
    }
  }

  if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
    test_column_equality<C>(reducedMatrix[0], get_column_content_via_iterators(m.get_column(0)));
    test_column_equality<C>(reducedMatrix[1], get_column_content_via_iterators(m.get_column(1)));
    test_column_equality<C>(reducedMatrix[2], get_column_content_via_iterators(m.get_column(2)));
    test_column_equality<C>(reducedMatrix[3], get_column_content_via_iterators(m.get_column(3)));
    test_column_equality<C>(reducedMatrix[4], get_column_content_via_iterators(m.get_column(4)));
    test_column_equality<C>(reducedMatrix[5], get_column_content_via_iterators(m.get_column(5)));
    test_column_equality<C>(reducedMatrix[6], get_column_content_via_iterators(m.get_column(6)));
    test_column_equality<C>(reducedMatrix[7], get_column_content_via_iterators(m.get_column(10)));
    test_column_equality<C>(reducedMatrix[8], get_column_content_via_iterators(m.get_column(11)));
    test_column_equality<C>(reducedMatrix[9], get_column_content_via_iterators(m.get_column(12)));
    test_column_equality<C>(reducedMatrix[10], get_column_content_via_iterators(m.get_column(13)));
    test_column_equality<C>(reducedMatrix[11], get_column_content_via_iterators(m.get_column(14)));
    test_column_equality<C>(reducedMatrix[12], get_column_content_via_iterators(m.get_column(15)));
    test_column_equality<C>(reducedMatrix[13], get_column_content_via_iterators(m.get_column(16)));
    test_column_equality<C>(reducedMatrix[14], get_column_content_via_iterators(m.get_column(17)));
    test_column_equality<C>(reducedMatrix[15], get_column_content_via_iterators(m.get_column(30)));
    test_column_equality<C>(reducedMatrix[16], get_column_content_via_iterators(m.get_column(31)));
  } else {
    test_content_equality(reducedMatrix, m);
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 7);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 9);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 3);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 4);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 10);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 14);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 6);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 12);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 11);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 15);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 13);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 16);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}